

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_string_substring(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  uint start;
  JSValue JVar1;
  int iVar2;
  JSValueUnion p_00;
  uint end;
  uint uVar3;
  JSRefCountHeader *p;
  JSValue v;
  JSValue JVar4;
  int b;
  int a;
  uint local_38;
  uint local_34;
  
  v = JS_ToStringCheckObject(ctx,this_val);
  p_00 = v.u;
  uVar3 = (uint)v.tag;
  if (uVar3 == 6) {
    return v;
  }
  iVar2 = JS_ToInt32Clamp(ctx,(int *)&local_34,*argv,0,*(uint *)((long)p_00.ptr + 4) & 0x7fffffff,0)
  ;
  if (iVar2 == 0) {
    local_38 = *(uint *)((long)p_00.ptr + 4) & 0x7fffffff;
    if (((int)argv[1].tag == 3) ||
       (JVar4.tag = argv[1].tag, JVar4.u.ptr = argv[1].u.ptr,
       iVar2 = JS_ToInt32Clamp(ctx,(int *)&local_38,JVar4,0,local_38,0), iVar2 == 0)) {
      end = local_38;
      if ((int)local_38 < (int)local_34) {
        end = local_34;
      }
      start = local_38;
      if ((int)local_34 < (int)local_38) {
        start = local_34;
      }
      JVar4 = js_sub_string(ctx,(JSString *)p_00.ptr,start,end);
      if (uVar3 < 0xfffffff5) {
        return JVar4;
      }
      iVar2 = *p_00.ptr;
      *(int *)p_00.ptr = iVar2 + -1;
      JVar1 = JVar4;
      goto joined_r0x00166f03;
    }
  }
  if (uVar3 < 0xfffffff5) {
    return (JSValue)(ZEXT816(6) << 0x40);
  }
  iVar2 = *p_00.ptr;
  *(int *)p_00.ptr = iVar2 + -1;
  JVar1 = (JSValue)(ZEXT816(6) << 0x40);
  JVar4 = (JSValue)(ZEXT816(6) << 0x40);
joined_r0x00166f03:
  if (iVar2 < 2) {
    __JS_FreeValueRT(ctx->rt,v);
    JVar4 = JVar1;
  }
  return JVar4;
}

Assistant:

static JSValue js_string_substring(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv)
{
    JSValue str, ret;
    int a, b, start, end;
    JSString *p;

    str = JS_ToStringCheckObject(ctx, this_val);
    if (JS_IsException(str))
        return str;
    p = JS_VALUE_GET_STRING(str);
    if (JS_ToInt32Clamp(ctx, &a, argv[0], 0, p->len, 0)) {
        JS_FreeValue(ctx, str);
        return JS_EXCEPTION;
    }
    b = p->len;
    if (!JS_IsUndefined(argv[1])) {
        if (JS_ToInt32Clamp(ctx, &b, argv[1], 0, p->len, 0)) {
            JS_FreeValue(ctx, str);
            return JS_EXCEPTION;
        }
    }
    if (a < b) {
        start = a;
        end = b;
    } else {
        start = b;
        end = a;
    }
    ret = js_sub_string(ctx, p, start, end);
    JS_FreeValue(ctx, str);
    return ret;
}